

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_decomp.c
# Opt level: O0

void undo_perm64(uchar *mat,int *P,int n)

{
  ulong uVar1;
  ulong uVar2;
  int c;
  int j;
  int i;
  uint64_t *mat_64_ptr;
  uint64_t tmp;
  uint64_t mask_cpy;
  int n_local;
  int *P_local;
  uchar *mat_local;
  
  for (i = n + -1; -1 < i; i = i + -1) {
    for (j = 0; j < n; j = j + 1) {
      uVar2 = -(long)(int)(uint)(j == P[i]);
      for (c = 0; c < n / 0x40; c = c + 1) {
        uVar1 = *(ulong *)(mat + (long)((n / 0x40) * i + c) * 8);
        *(ulong *)(mat + (long)((n / 0x40) * i + c) * 8) =
             *(ulong *)(mat + (long)((n / 0x40) * i + c) * 8) & (uVar2 ^ 0xffffffffffffffff) |
             *(ulong *)(mat + (long)((n / 0x40) * j + c) * 8) & uVar2;
        *(ulong *)(mat + (long)((n / 0x40) * j + c) * 8) =
             *(ulong *)(mat + (long)((n / 0x40) * j + c) * 8) & (uVar2 ^ 0xffffffffffffffff) |
             uVar1 & uVar2;
      }
    }
  }
  return;
}

Assistant:

void undo_perm64(unsigned char *mat, int *P, int n)
{
  uint64_t mask_cpy;
  uint64_t tmp;
  uint64_t *mat_64_ptr = (uint64_t*)mat;

  for(int i = n-1; i >= 0; i--)
  {
    for(int j = 0; j < n; j++)
    {
      mask_cpy = (j == P[i]);
      mask_cpy = -mask_cpy;

      for(int c = 0; c < n/64; c++)
      {
        tmp = mat_64_ptr[(n/64)*i + c];
        mat_64_ptr[(n/64)*i + c] = (mat_64_ptr[(n/64)*i + c] & ~mask_cpy) | (mat_64_ptr[(n/64)*j + c] & mask_cpy);
        mat_64_ptr[(n/64)*j + c] = (mat_64_ptr[(n/64)*j + c] & ~mask_cpy) | (tmp & mask_cpy);
      }
    }
  }
}